

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_layout_decoder.cpp
# Opt level: O0

MapLayout * io::decode_map_layout(ROM *rom,uint32_t addr)

{
  pointer *__return_storage_ptr__;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  __first;
  byte width_00;
  byte height_00;
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint8_t *data;
  MapLayout *this;
  reference pvVar5;
  undefined1 local_138 [8];
  vector<unsigned_short,_std::allocator<unsigned_short>_> heightmap_data;
  uint32_t local_118;
  pair<unsigned_char,_unsigned_char> local_113;
  allocator<unsigned_short> local_111;
  pair<unsigned_char,_unsigned_char> heightmap_size;
  iterator iStack_110;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_100;
  allocator<unsigned_short> local_e1;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  local_e0;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  local_d8;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_d0;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  local_b8;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  local_b0;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  halfway_iter;
  vector<unsigned_short,_std::allocator<unsigned_short>_> tile_values;
  vector<unsigned_short,_std::allocator<unsigned_short>_> tile_offsets;
  size_t i;
  undefined2 local_68;
  ushort local_66;
  array<unsigned_short,_14UL> offset_dictionary;
  pair<unsigned_short,_unsigned_short> tile_dictionary;
  MapLayout *map_layout;
  undefined1 local_30 [4];
  uint8_t height;
  uint8_t width;
  uint8_t top;
  uint8_t left;
  BitstreamReader bitstream;
  uint32_t addr_local;
  ROM *rom_local;
  
  bitstream._size._4_4_ = addr;
  data = md::ROM::iterator_at(rom,addr);
  BitstreamReader::BitstreamReader((BitstreamReader *)local_30,data);
  uVar1 = BitstreamReader::read_bits((BitstreamReader *)local_30,'\b');
  uVar2 = BitstreamReader::read_bits((BitstreamReader *)local_30,'\b');
  uVar3 = BitstreamReader::read_bits((BitstreamReader *)local_30,'\b');
  width_00 = (char)uVar3 + 1;
  uVar3 = BitstreamReader::read_bits((BitstreamReader *)local_30,'\b');
  uVar4 = uVar3 + 1 >> 1;
  height_00 = (byte)uVar4;
  this = (MapLayout *)operator_new(0x50);
  MapLayout::MapLayout(this,(uint8_t)uVar1,(uint8_t)uVar2,width_00,height_00);
  std::pair<unsigned_short,_unsigned_short>::pair<unsigned_short,_unsigned_short,_true>
            ((pair<unsigned_short,_unsigned_short> *)(offset_dictionary._M_elems + 10));
  uVar1 = BitstreamReader::read_bits((BitstreamReader *)local_30,'\n');
  offset_dictionary._M_elems[0xb] = (unsigned_short)uVar1;
  uVar1 = BitstreamReader::read_bits((BitstreamReader *)local_30,'\n');
  offset_dictionary._M_elems[10] = (unsigned_short)uVar1;
  i._4_2_ = 0xffff;
  i._6_2_ = 1;
  local_68 = 2;
  local_66 = (ushort)width_00;
  offset_dictionary._M_elems[0] = (ushort)width_00 << 1;
  offset_dictionary._M_elems[1] = width_00 + 1;
  offset_dictionary._M_elems[2] = 0;
  offset_dictionary._M_elems[3] = 0;
  offset_dictionary._M_elems[4] = 0;
  offset_dictionary._M_elems[5] = 0;
  offset_dictionary._M_elems[6] = 0;
  offset_dictionary._M_elems[7] = 0;
  offset_dictionary._M_elems[8] = 0;
  offset_dictionary._M_elems[9] = 0;
  for (tile_offsets.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage = (pointer)0x6;
      tile_offsets.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage < (pointer)0xe;
      tile_offsets.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)tile_offsets.
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage + 1)) {
    uVar1 = BitstreamReader::read_bits((BitstreamReader *)local_30,'\f');
    pvVar5 = std::array<unsigned_short,_14UL>::operator[]
                       ((array<unsigned_short,_14UL> *)((long)&i + 4),
                        (size_type)
                        tile_offsets.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    *pvVar5 = (value_type_conflict2)uVar1;
  }
  BitstreamReader::next_bit((BitstreamReader *)local_30);
  __return_storage_ptr__ =
       &tile_values.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  decode_offsets((vector<unsigned_short,_std::allocator<unsigned_short>_> *)__return_storage_ptr__,
                 (BitstreamReader *)local_30,(array<unsigned_short,_14UL> *)((long)&i + 4),
                 (ushort)width_00,(ushort)height_00);
  decode_tile_values((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&halfway_iter,
                     (BitstreamReader *)local_30,
                     (vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                     __return_storage_ptr__,
                     (pair<unsigned_short,_unsigned_short> *)(offset_dictionary._M_elems + 10));
  local_b8._M_current =
       (unsigned_short *)
       std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                 ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&halfway_iter);
  local_b0 = __gnu_cxx::
             __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
             ::operator+(&local_b8,(ulong)((uint)width_00 * (uVar4 & 0xff)));
  local_d8._M_current =
       (unsigned_short *)
       std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                 ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&halfway_iter);
  local_e0._M_current = local_b0._M_current;
  std::allocator<unsigned_short>::allocator(&local_e1);
  std::vector<unsigned_short,std::allocator<unsigned_short>>::
  vector<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>,void>
            ((vector<unsigned_short,std::allocator<unsigned_short>> *)&local_d0,local_d8,local_e0,
             &local_e1);
  MapLayout::foreground_tiles(this,&local_d0);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector(&local_d0);
  std::allocator<unsigned_short>::~allocator(&local_e1);
  __first._M_current = local_b0._M_current;
  iStack_110 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end
                         ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&halfway_iter);
  std::allocator<unsigned_short>::allocator(&local_111);
  std::vector<unsigned_short,std::allocator<unsigned_short>>::
  vector<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>,void>
            ((vector<unsigned_short,std::allocator<unsigned_short>> *)&local_100,__first,
             (__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
              )iStack_110._M_current,&local_111);
  MapLayout::background_tiles(this,&local_100);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector(&local_100);
  std::allocator<unsigned_short>::~allocator(&local_111);
  BitstreamReader::skip_byte_remainder((BitstreamReader *)local_30);
  local_118 = BitstreamReader::read_bits((BitstreamReader *)local_30,'\b');
  heightmap_data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ =
       BitstreamReader::read_bits((BitstreamReader *)local_30,'\b');
  std::pair<unsigned_char,_unsigned_char>::pair<unsigned_int,_unsigned_int,_true>
            (&local_113,&local_118,
             (uint *)((long)&heightmap_data.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  decode_heightmap((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_138,
                   (BitstreamReader *)local_30,local_113);
  MapLayout::heightmap
            (this,(vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_138,local_113);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_138);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&halfway_iter);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
             &tile_values.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return this;
}

Assistant:

MapLayout* io::decode_map_layout(const md::ROM& rom, uint32_t addr)
{
    BitstreamReader bitstream(rom.iterator_at(addr));

    uint8_t left = bitstream.read_bits(8);
    uint8_t top = bitstream.read_bits(8);
    uint8_t width = bitstream.read_bits(8) + 1;
    uint8_t height = (bitstream.read_bits(8) + 1) / 2;

    MapLayout* map_layout = new MapLayout(left, top, width, height);

    std::pair<uint16_t, uint16_t> tile_dictionary {};
    tile_dictionary.second = bitstream.read_bits(10);
    tile_dictionary.first = bitstream.read_bits(10);

    std::array<uint16_t, 14> offset_dictionary {
            0xFFFF, // Read new element
            0x0001, // Previous element
            0x0002, // Element before previous element
            static_cast<uint16_t>(width), // Element in previous row
            static_cast<uint16_t>(width * 2), // Element two rows before
            static_cast<uint16_t>(width + 1), // ...
            // Plus 8 dynamic values determined during compression
            0x0000, 0x0000, 0x0000, 0x0000,
            0x0000, 0x0000, 0x0000, 0x0000
    };
    for(std::size_t i = 6; i < 14; ++i)
        offset_dictionary[i] = bitstream.read_bits(12);

    // Skip a bit that is systematically 0
    bitstream.next_bit();

    std::vector<uint16_t> tile_offsets = decode_offsets(bitstream, offset_dictionary, width, height);
    std::vector<uint16_t> tile_values = decode_tile_values(bitstream, tile_offsets, tile_dictionary);

    auto halfway_iter = tile_values.begin() + (width * height);
    map_layout->foreground_tiles(std::vector<uint16_t>(tile_values.begin(), halfway_iter));
    map_layout->background_tiles(std::vector<uint16_t>(halfway_iter, tile_values.end()));

    bitstream.skip_byte_remainder();

    std::pair<uint8_t, uint8_t> heightmap_size { bitstream.read_bits(8), bitstream.read_bits(8) };
    std::vector<uint16_t> heightmap_data = decode_heightmap(bitstream, heightmap_size);
    map_layout->heightmap(heightmap_data, heightmap_size);

    return map_layout;
}